

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groups.c
# Opt level: O2

int comex_group_create(int n,int *pid_list,comex_group_t id_parent,comex_group_t *id_child)

{
  MPI_Group *ppoVar1;
  int iVar2;
  uint uVar3;
  comex_igroup_t *pcVar4;
  group_link *pgVar5;
  comex_igroup_t *pcVar6;
  uint uVar7;
  uint uVar8;
  MPI_Comm comm;
  int grp_me;
  int *local_58;
  MPI_Group *local_50;
  group_link *local_48;
  MPI_Comm comm2;
  MPI_Comm comm1;
  
  pcVar6 = group_list;
  do {
    pcVar4 = pcVar6;
    pcVar6 = pcVar4->next;
  } while (pcVar4->next != (group_link *)0x0);
  local_58 = pid_list;
  pgVar5 = (group_link *)malloc(0x20);
  iVar2 = pcVar4->id + 1;
  pgVar5->id = iVar2;
  pgVar5->comm = (MPI_Comm)&ompi_mpi_comm_null;
  pgVar5->group = (MPI_Group)&ompi_mpi_group_null;
  pgVar5->next = (group_link *)0x0;
  ppoVar1 = &pgVar5->group;
  pcVar4->next = pgVar5;
  *id_child = iVar2;
  pcVar6 = comex_get_igroup_from_group(id_parent);
  iVar2 = MPI_Group_incl(pcVar6->group,n,local_58,ppoVar1);
  if (iVar2 != 0) {
    comex_error("MPI_Group_incl: Failed ",iVar2);
  }
  MPI_Group_rank(*ppoVar1,&grp_me);
  if (grp_me != -0x7ffe) {
    local_50 = ppoVar1;
    local_48 = pgVar5;
    if (grp_me < 0) {
      __assert_fail("grp_me>=0",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-mpi/groups.c"
                    ,0xe1,"int comex_group_create(int, int *, comex_group_t, comex_group_t *)");
    }
    MPI_Comm_dup(&ompi_mpi_comm_self,&comm);
    uVar7 = grp_me;
    for (uVar8 = 1; pgVar5 = local_48, ppoVar1 = local_50, (int)uVar8 < n; uVar8 = uVar8 * 2) {
      uVar3 = uVar8 ^ uVar7;
      if ((int)uVar3 < n) {
        MPI_Intercomm_create(comm,0,pcVar6->comm,local_58[(int)uVar3],0,&comm1);
        MPI_Comm_free(&comm);
        MPI_Intercomm_merge(comm1,(int)uVar3 <= (int)uVar7,&comm2);
        MPI_Comm_free(&comm1);
        comm = comm2;
      }
      uVar7 = uVar7 & ~uVar8;
    }
    local_48->comm = comm;
    MPI_Group_free(local_50);
    MPI_Comm_group(pgVar5->comm,ppoVar1);
  }
  return 0;
}

Assistant:

int comex_group_create(
        int n, int *pid_list, comex_group_t id_parent, comex_group_t *id_child)
{
    int status;
    int grp_me;
    comex_igroup_t *igroup_child = NULL;
    MPI_Group      *group_child = NULL;
    MPI_Comm       *comm_child = NULL;
    comex_igroup_t *igroup_parent = NULL;
    MPI_Group      *group_parent = NULL;
    MPI_Comm       *comm_parent = NULL;

    /* create the node in the linked list of groups and */
    /* get the child's MPI_Group and MPI_Comm, to be populated shortly */
    comex_create_group_and_igroup(id_child, &igroup_child);
    group_child = &(igroup_child->group);
    comm_child  = &(igroup_child->comm);

    /* get the parent's MPI_Group and MPI_Comm */
    igroup_parent = comex_get_igroup_from_group(id_parent);
    group_parent = &(igroup_parent->group);
    comm_parent  = &(igroup_parent->comm);

    status = MPI_Group_incl(*group_parent, n, pid_list, group_child);
    if (status != MPI_SUCCESS) {
        comex_error("MPI_Group_incl: Failed ", status);
    }

    {
        MPI_Comm comm, comm1, comm2;
        int lvl=1, local_ldr_pos;
        MPI_Group_rank(*group_child, &grp_me);
        if (grp_me == MPI_UNDEFINED) {
            /* FIXME: keeping the group around for now */
            return COMEX_SUCCESS;
        }
        /* SK: sanity check for the following bitwise operations */
        assert(grp_me>=0);
        MPI_Comm_dup(MPI_COMM_SELF, &comm); /* FIXME: can be optimized away */
        local_ldr_pos = grp_me;
        while(n>lvl) {
            int tag=0;
            int remote_ldr_pos = local_ldr_pos^lvl;
            if (remote_ldr_pos < n) {
                int remote_leader = pid_list[remote_ldr_pos];
                MPI_Comm peer_comm = *comm_parent;
                int high = (local_ldr_pos<remote_ldr_pos)?0:1;
                MPI_Intercomm_create(
                        comm, 0, peer_comm, remote_leader, tag, &comm1);
                MPI_Comm_free(&comm);
                MPI_Intercomm_merge(comm1, high, &comm2);
                MPI_Comm_free(&comm1);
                comm = comm2;
            }
            local_ldr_pos &= ((~0)^lvl);
            lvl<<=1;
        }
        *comm_child = comm;
        /* cleanup temporary group (from MPI_Group_incl above) */
        MPI_Group_free(group_child);
        /* get the actual group associated with comm */
        MPI_Comm_group(*comm_child, group_child);
    }

    return COMEX_SUCCESS;
}